

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void PDHG_PrintUserParamHelper(void)

{
  PDHG_PrintHugeCUPDHG();
  printf("CUPDHG User Parameters:\n");
  printf("\n");
  printf("    -h: print this helper\n");
  printf("\n");
  printf("    -nIterLim:  maximum iteration number\n");
  printf("                type:    int\n");
  printf("                default: INT_MAX\n");
  printf("                range:   >= 0\n");
  printf("\n");
  printf("    -ifScaling: whether to use scaling\n");
  printf("                type:    bool\n");
  printf("                default: true\n");
  printf("                range:   true or false\n");
  printf("\n");
  printf("    -eLineSearchMethod: which line search method to use\n");
  printf("                        0-Fixed, 1-Malitsky (not support), 2-Adaptive\n");
  printf("                type:    int\n");
  printf("                default: 2\n");
  printf("                range:   0 to 2\n");
  printf("\n");
  printf("    -dPrimalTol: primal tolerance\n");
  printf("                type:    double\n");
  printf("                default: 1e-4\n");
  printf("                range:   >= 0\n");
  printf("\n");
  printf("    -dDualTol: dual tolerance\n");
  printf("                type:    double\n");
  printf("                default: 1e-4\n");
  printf("                range:   >= 0\n");
  printf("\n");
  printf("    -dGapTol: gap tolerance\n");
  printf("                type:    double\n");
  printf("                default: 1e-4\n");
  printf("                range:   >= 0\n");
  printf("\n");
  printf("    -dFeasTol: feasibility tolerance\n");
  printf("                type:    double\n");
  printf("                default: 1e-8\n");
  printf("                range:   >= 0\n");
  printf("\n");
  printf("    -dTimeLim: time limit (in seconds)\n");
  printf("                type:    double\n");
  printf("                default: 3600\n");
  printf("                range:   >= 0\n");
  printf("\n");
  printf("    -eRestartMethod: which restart method to use\n");
  printf("                     0-None, 1-KKTversion\n");
  printf("                type:    int\n");
  printf("                default: 1\n");
  printf("                range:   0 to 1\n");
  printf("\n");
  printf("    -ifRuizScaling: whether to use Ruiz scaling\n");
  printf("                type:    bool\n");
  printf("                default: true\n");
  printf("                range:   true or false\n");
  printf("\n");
  printf("    -ifL2Scaling: whether to use L2 scaling\n");
  printf("                type:    bool\n");
  printf("                default: false\n");
  printf("                range:   true or false\n");
  printf("\n");
  printf("    -ifPcScaling: whether to use Pock-Chambolle scaling\n");
  printf("                type:    bool\n");
  printf("                default: true\n");
  printf("                range:   true or false\n");
  printf("\n");
  return;
}

Assistant:

void PDHG_PrintUserParamHelper(void) {
  PDHG_PrintHugeCUPDHG();

  cupdlp_printf("CUPDHG User Parameters:\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -h: print this helper\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -nIterLim:  maximum iteration number\n");
  cupdlp_printf("                type:    int\n");
  cupdlp_printf("                default: INT_MAX\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifScaling: whether to use scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: true\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -eLineSearchMethod: which line search method to use\n");
  cupdlp_printf(
      "                        0-Fixed, 1-Malitsky (not support), "
      "2-Adaptive\n");
  cupdlp_printf("                type:    int\n");
  cupdlp_printf("                default: 2\n");
  cupdlp_printf("                range:   0 to 2\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dPrimalTol: primal tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-4\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dDualTol: dual tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-4\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dGapTol: gap tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-4\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dFeasTol: feasibility tolerance\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 1e-8\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -dTimeLim: time limit (in seconds)\n");
  cupdlp_printf("                type:    double\n");
  cupdlp_printf("                default: 3600\n");
  cupdlp_printf("                range:   >= 0\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -eRestartMethod: which restart method to use\n");
  cupdlp_printf("                     0-None, 1-KKTversion\n");
  cupdlp_printf("                type:    int\n");
  cupdlp_printf("                default: 1\n");
  cupdlp_printf("                range:   0 to 1\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifRuizScaling: whether to use Ruiz scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: true\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifL2Scaling: whether to use L2 scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: false\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  cupdlp_printf("    -ifPcScaling: whether to use Pock-Chambolle scaling\n");
  cupdlp_printf("                type:    bool\n");
  cupdlp_printf("                default: true\n");
  cupdlp_printf("                range:   true or false\n");
  cupdlp_printf("\n");

  // cupdlp_printf(
  //     "    -ifPre: whether to use HiGHS presolver (and thus postsolver)\n");
  // cupdlp_printf("                type:    bool\n");
  // cupdlp_printf("                default: true\n");
  // cupdlp_printf("                range:   true or false\n");
  // cupdlp_printf("\n");
}